

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_add.cxx
# Opt level: O2

int __thiscall Fl_Menu_::remove(Fl_Menu_ *this,char *__filename)

{
  uint uVar1;
  Fl_Menu_Item *__src;
  void *pvVar2;
  Fl_Menu_Item *m;
  Fl_Menu_Item *pFVar3;
  int iVar4;
  Fl_Menu_Item *this_00;
  
  uVar1 = size(this);
  iVar4 = (int)__filename;
  if ((int)uVar1 <= iVar4 || iVar4 < 0) {
    return CONCAT31((int3)(uVar1 >> 8),iVar4 < 0);
  }
  if (this->alloc == '\0') {
    copy(this,(EVP_PKEY_CTX *)this->menu_,(EVP_PKEY_CTX *)0x0);
  }
  this_00 = this->menu_ + ((ulong)__filename & 0xffffffff);
  __src = Fl_Menu_Item::next(this_00,1);
  pFVar3 = this_00;
  if (1 < this->alloc) {
    for (; pFVar3 < __src; pFVar3 = pFVar3 + 1) {
      free(pFVar3->text);
    }
  }
  pvVar2 = memmove(this_00,__src,(long)this->menu_ + ((ulong)uVar1 * 0x38 - (long)__src));
  return (int)pvVar2;
}

Assistant:

void Fl_Menu_::remove(int i) {
  int n = size();
  if (i<0 || i>=n) return;
  if (!alloc) copy(menu_);
  // find the next item, skipping submenus:
  Fl_Menu_Item* item = menu_+i;
  const Fl_Menu_Item* next_item = item->next();
  // delete the text only if all items were created with add():
  if (alloc > 1) {
    for (Fl_Menu_Item* m = item; m < next_item; m++)
      if (m->text) free((void*)(m->text));
  }
  // MRS: "n" is the menu size(), which includes the trailing NULL entry...
  memmove(item, next_item, (menu_+n-next_item)*sizeof(Fl_Menu_Item));
}